

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O3

CachedSSBO * __thiscall
Diligent::ShaderResourceCacheGL::GetConstSSBO(ShaderResourceCacheGL *this,Uint32 CacheOffset)

{
  ulong uVar1;
  char (*in_R8) [18];
  string msg;
  Uint32 local_34;
  string local_30;
  
  uVar1 = (ulong)this->m_SSBOsOffset;
  if ((uint)(this->m_MemoryEndOffset - uVar1 >> 4) <= CacheOffset) {
    local_34 = CacheOffset;
    FormatString<char[29],unsigned_int,char[18]>
              (&local_30,(Diligent *)"Shader storage block index (",(char (*) [29])&local_34,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetConstSSBO",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x13a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    uVar1 = (ulong)this->m_SSBOsOffset;
    CacheOffset = local_34;
  }
  return (CachedSSBO *)
         ((this->m_pResourceData)._M_t.
          super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          ._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
         (ulong)CacheOffset * 0x10 + uVar1);
}

Assistant:

const CachedSSBO& GetConstSSBO(Uint32 CacheOffset) const
    {
        VERIFY(CacheOffset < GetSSBOCount(), "Shader storage block index (", CacheOffset, ") is out of range");
        return reinterpret_cast<CachedSSBO*>(m_pResourceData.get() + m_SSBOsOffset)[CacheOffset];
    }